

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCompareValues(xmlXPathParserContextPtr ctxt,int inf,int strict)

{
  int iVar1;
  int iVar2;
  xmlXPathObjectPtr local_40;
  xmlXPathObjectPtr arg2;
  xmlXPathObjectPtr arg1;
  int arg2i;
  int arg1i;
  int ret;
  int strict_local;
  int inf_local;
  xmlXPathParserContextPtr ctxt_local;
  
  arg2i = 0;
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else {
    local_40 = valuePop(ctxt);
    arg2 = valuePop(ctxt);
    if ((arg2 == (xmlXPathObjectPtr)0x0) || (local_40 == (xmlXPathObjectPtr)0x0)) {
      if (arg2 == (xmlXPathObjectPtr)0x0) {
        xmlXPathReleaseObject(ctxt->context,local_40);
      }
      else {
        xmlXPathReleaseObject(ctxt->context,arg2);
      }
      xmlXPathErr(ctxt,10);
      ctxt_local._4_4_ = 0;
    }
    else if ((((local_40->type == XPATH_NODESET) || (local_40->type == XPATH_XSLT_TREE)) ||
             (arg2->type == XPATH_NODESET)) || (arg2->type == XPATH_XSLT_TREE)) {
      if (((local_40->type == XPATH_NODESET) || (local_40->type == XPATH_XSLT_TREE)) &&
         ((arg2->type == XPATH_NODESET || (arg2->type == XPATH_XSLT_TREE)))) {
        arg2i = xmlXPathCompareNodeSets(ctxt,inf,strict,arg2,local_40);
      }
      else if ((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE)) {
        arg2i = xmlXPathCompareNodeSetValue(ctxt,inf,strict,arg2,local_40);
      }
      else {
        arg2i = xmlXPathCompareNodeSetValue
                          (ctxt,(uint)((inf != 0 ^ 0xffU) & 1),strict,local_40,arg2);
      }
      ctxt_local._4_4_ = arg2i;
    }
    else {
      if (arg2->type != XPATH_NUMBER) {
        valuePush(ctxt,arg2);
        xmlXPathNumberFunction(ctxt,1);
        arg2 = valuePop(ctxt);
      }
      if (local_40->type != XPATH_NUMBER) {
        valuePush(ctxt,local_40);
        xmlXPathNumberFunction(ctxt,1);
        local_40 = valuePop(ctxt);
      }
      if (ctxt->error == 0) {
        iVar1 = xmlXPathIsNaN(arg2->floatval);
        if ((iVar1 == 0) && (iVar1 = xmlXPathIsNaN(local_40->floatval), iVar1 == 0)) {
          iVar1 = xmlXPathIsInf(arg2->floatval);
          iVar2 = xmlXPathIsInf(local_40->floatval);
          if ((inf == 0) || (strict == 0)) {
            if ((inf == 0) || (strict != 0)) {
              if ((inf == 0) && (strict != 0)) {
                if (((iVar1 == 1) && (iVar2 != 1)) || ((iVar2 == -1 && (iVar1 != -1)))) {
                  arg2i = 1;
                }
                else if ((iVar1 == 0) && (iVar2 == 0)) {
                  arg2i = (int)(local_40->floatval <= arg2->floatval &&
                               arg2->floatval != local_40->floatval);
                }
                else {
                  arg2i = 0;
                }
              }
              else if ((inf == 0) && (strict == 0)) {
                if ((iVar1 == 1) || (iVar2 == -1)) {
                  arg2i = 1;
                }
                else if ((iVar1 == 0) && (iVar2 == 0)) {
                  arg2i = (int)(local_40->floatval <= arg2->floatval);
                }
                else {
                  arg2i = 0;
                }
              }
            }
            else if ((iVar1 == -1) || (iVar2 == 1)) {
              arg2i = 1;
            }
            else if ((iVar1 == 0) && (iVar2 == 0)) {
              arg2i = (int)(arg2->floatval <= local_40->floatval);
            }
            else {
              arg2i = 0;
            }
          }
          else if (((iVar1 == -1) && (iVar2 != -1)) || ((iVar2 == 1 && (iVar1 != 1)))) {
            arg2i = 1;
          }
          else if ((iVar1 == 0) && (iVar2 == 0)) {
            arg2i = (int)(arg2->floatval < local_40->floatval);
          }
          else {
            arg2i = 0;
          }
        }
        else {
          arg2i = 0;
        }
      }
      xmlXPathReleaseObject(ctxt->context,arg2);
      xmlXPathReleaseObject(ctxt->context,local_40);
      ctxt_local._4_4_ = arg2i;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlXPathCompareValues(xmlXPathParserContextPtr ctxt, int inf, int strict) {
    int ret = 0, arg1i = 0, arg2i = 0;
    xmlXPathObjectPtr arg1, arg2;

    if ((ctxt == NULL) || (ctxt->context == NULL)) return(0);
    arg2 = valuePop(ctxt);
    arg1 = valuePop(ctxt);
    if ((arg1 == NULL) || (arg2 == NULL)) {
	if (arg1 != NULL)
	    xmlXPathReleaseObject(ctxt->context, arg1);
	else
	    xmlXPathReleaseObject(ctxt->context, arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }

    if ((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE) ||
      (arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
	/*
	 * If either argument is a XPATH_NODESET or XPATH_XSLT_TREE the two arguments
	 * are not freed from within this routine; they will be freed from the
	 * called routine, e.g. xmlXPathCompareNodeSets or xmlXPathCompareNodeSetValue
	 */
	if (((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE)) &&
	  ((arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE))){
	    ret = xmlXPathCompareNodeSets(ctxt, inf, strict, arg1, arg2);
	} else {
	    if ((arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
		ret = xmlXPathCompareNodeSetValue(ctxt, inf, strict,
			                          arg1, arg2);
	    } else {
		ret = xmlXPathCompareNodeSetValue(ctxt, !inf, strict,
			                          arg2, arg1);
	    }
	}
	return(ret);
    }

    if (arg1->type != XPATH_NUMBER) {
	valuePush(ctxt, arg1);
	xmlXPathNumberFunction(ctxt, 1);
	arg1 = valuePop(ctxt);
    }
    if (arg2->type != XPATH_NUMBER) {
	valuePush(ctxt, arg2);
	xmlXPathNumberFunction(ctxt, 1);
	arg2 = valuePop(ctxt);
    }
    if (ctxt->error)
        goto error;
    /*
     * Add tests for infinity and nan
     * => feedback on 3.4 for Inf and NaN
     */
    /* Hand check NaN and Infinity comparisons */
    if (xmlXPathIsNaN(arg1->floatval) || xmlXPathIsNaN(arg2->floatval)) {
	ret=0;
    } else {
	arg1i=xmlXPathIsInf(arg1->floatval);
	arg2i=xmlXPathIsInf(arg2->floatval);
	if (inf && strict) {
	    if ((arg1i == -1 && arg2i != -1) ||
		(arg2i == 1 && arg1i != 1)) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval < arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (inf && !strict) {
	    if (arg1i == -1 || arg2i == 1) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval <= arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (!inf && strict) {
	    if ((arg1i == 1 && arg2i != 1) ||
		(arg2i == -1 && arg1i != -1)) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval > arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (!inf && !strict) {
	    if (arg1i == 1 || arg2i == -1) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval >= arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
    }
error:
    xmlXPathReleaseObject(ctxt->context, arg1);
    xmlXPathReleaseObject(ctxt->context, arg2);
    return(ret);
}